

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> * __thiscall
kj::_::NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>::
emplace<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>
          (NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>> *this,
          OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *params)

{
  OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *params_00;
  OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *params_local;
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>)0x0;
    dtor<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>
              ((OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *)(this + 8));
  }
  params_00 = fwd<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>(params);
  ctor<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>,kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>
            ((OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *)(this + 8),params_00)
  ;
  *this = (NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>)0x1;
  return (OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }